

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::createPredList(Graph *this)

{
  uint uVar1;
  long lVar2;
  iterator __position;
  int (*paiVar3) [50];
  ulong uVar4;
  int j;
  ulong uVar5;
  int iVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  int local_3c;
  vector<int,_std::allocator<int>_> *local_38;
  
  uVar1 = this->num_of_vert;
  pvVar8 = this->pred_list;
  lVar7 = 0;
  do {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar7),1);
    lVar2 = *(long *)((long)&(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar7);
    if (*(long *)((long)&this->pred_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar7) != lVar2) {
      *(long *)((long)&this->pred_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + lVar7) = lVar2;
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x4b0);
  if (0 < (int)uVar1) {
    paiVar3 = this->adj_matrix;
    uVar4 = 0;
    local_38 = pvVar8;
    do {
      iVar6 = (int)uVar4 + 1;
      uVar5 = 0;
      pvVar8 = local_38;
      do {
        if (0 < (*paiVar3)[uVar5]) {
          __position._M_current =
               (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_3c = iVar6;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (pvVar8,__position,&local_3c);
          }
          else {
            *__position._M_current = iVar6;
            (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
        uVar5 = uVar5 + 1;
        pvVar8 = pvVar8 + 1;
      } while (uVar1 != uVar5);
      uVar4 = uVar4 + 1;
      paiVar3 = paiVar3 + 1;
    } while (uVar4 != uVar1);
  }
  return;
}

Assistant:

void Graph::createPredList(){
   int nv = this->num_of_vert;
   this->clearPredList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] >= 1)
            // pushes index of current column + 1 (current vertex)
            this->pred_list[j].push_back(i + 1);
      }
   return void();
}